

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.cpp
# Opt level: O2

void VCFrontEnd::showHelpPage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: [options] <input_file>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-n INT    : set the number of clusters, default 400");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-f PATH   : set the name of the output file, a default name will be generated if not provided"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-r INT    : set the radius of the ring used by adaptive sampling, default 2"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-seed INT : set the seed for srand(), default time(0)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-q        : use quadric based placement policy for vertex position");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-o1       : enable adaptive sampling");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-o2       : enable adaptive sampling with anisotropic metric");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-o3       : shortcut for -o2 -q");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-v        : enable verification for the clusters")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-quad -f PATH -ratio FLOAT : run Quadric Error Metrics algorithm instead"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-h        : show this help page");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void VCFrontEnd::showHelpPage()
{
	cout << "Usage: [options] <input_file>" << endl;
	cout << "-n INT    : set the number of clusters, default 400" << endl;
	cout << "-f PATH   : set the name of the output file, a default name will be generated if not provided" << endl;
	cout << "-r INT    : set the radius of the ring used by adaptive sampling, default 2" << endl;
	cout << "-seed INT : set the seed for srand(), default time(0)" << endl;
	cout << "-q        : use quadric based placement policy for vertex position" << endl;
	cout << "-o1       : enable adaptive sampling" << endl;
	cout << "-o2       : enable adaptive sampling with anisotropic metric" << endl;
	cout << "-o3       : shortcut for -o2 -q" << endl;
	cout << "-v        : enable verification for the clusters" << endl;
	cout << "-quad -f PATH -ratio FLOAT : run Quadric Error Metrics algorithm instead" << endl;
	cout << "-h        : show this help page" << endl;
}